

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O0

void opengv::absolute_pose::modules::gpnp5::sPolynomial32
               (Matrix<double,_44,_80,_0,_44,_80> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Scalar *pSVar5;
  DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1> *this;
  Index in_stack_fffffffffffffcd8;
  Scalar row;
  DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1> *in_stack_fffffffffffffce0;
  
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,0x9f0926);
  row = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (in_stack_fffffffffffffce0,(Index)row,0x9f0946);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1> *)(row / *pSVar5);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f096b);
  *pSVar5 = (Scalar)this;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f098c);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f09ad);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f09d4);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f09f5);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0a2d);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0a54);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0a75);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0aad);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0ad4);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0af5);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0b2d);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0b54);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0b75);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0b96);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0bbd);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0bde);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0bff);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0c26);
  dVar3 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0c47);
  dVar4 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0c78);
  *pSVar5 = dVar1 / dVar2 - dVar3 / dVar4;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0c99);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0cbd);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0cea);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0d0e);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0d32);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0d5f);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0d83);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0dbe);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0deb);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0e0f);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0e4a);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0e77);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0e9b);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0ed6);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0f03);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0f27);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0f4b);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0f78);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0f9c);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0fc0);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f0fed);
  dVar3 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1011);
  dVar4 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f104b);
  *pSVar5 = dVar1 / dVar2 - dVar3 / dVar4;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f106f);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1093);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f10c0);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f10e4);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1108);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1135);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1159);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1194);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f11c1);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f11e5);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1209);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1236);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f125a);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1295);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f12c2);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f12e6);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1321);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f134e);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1372);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f13ad);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f13da);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f13fe);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1422);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f144f);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1473);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1497);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f14c4);
  dVar3 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f14e8);
  dVar4 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1522);
  *pSVar5 = dVar1 / dVar2 - dVar3 / dVar4;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1546);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f156a);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1597);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f15bb);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f15df);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f160c);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1630);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f166b);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1698);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f16bc);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f16f7);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1724);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1748);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1783);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f17b0);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f17d4);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f17f8);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1825);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1849);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f186d);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f189a);
  dVar3 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f18be);
  dVar4 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f18f8);
  *pSVar5 = dVar1 / dVar2 - dVar3 / dVar4;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f191c);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1940);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f196d);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1991);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f19b5);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f19e2);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1a06);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1a41);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1a6e);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1a92);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1ab6);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1ae3);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1b07);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1b42);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1b6f);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1b93);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1bce);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1bfb);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1c1f);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1c5a);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1c87);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1cab);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1ccf);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1cfc);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1d20);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1d44);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1d71);
  dVar3 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1d95);
  dVar4 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1dcf);
  *pSVar5 = dVar1 / dVar2 - dVar3 / dVar4;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1df3);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1e17);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1e44);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1e68);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1e8c);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1eb9);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1edd);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1f18);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1f45);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1f69);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1f8d);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1fba);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f1fde);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f2019);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f2046);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f206a);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f208e);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9f20bb);
  *pSVar5 = dVar1 / dVar2;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp5::sPolynomial32( Eigen::Matrix<double,44,80> & groebnerMatrix )
{
  groebnerMatrix(32,0) = groebnerMatrix(12,42)/(groebnerMatrix(12,41));
  groebnerMatrix(32,1) = groebnerMatrix(12,43)/(groebnerMatrix(12,41));
  groebnerMatrix(32,2) = -groebnerMatrix(14,50)/(groebnerMatrix(14,43));
  groebnerMatrix(32,3) = -groebnerMatrix(14,51)/(groebnerMatrix(14,43));
  groebnerMatrix(32,5) = -groebnerMatrix(14,52)/(groebnerMatrix(14,43));
  groebnerMatrix(32,7) = groebnerMatrix(12,50)/(groebnerMatrix(12,41));
  groebnerMatrix(32,8) = (groebnerMatrix(12,51)/(groebnerMatrix(12,41))-groebnerMatrix(14,53)/(groebnerMatrix(14,43)));
  groebnerMatrix(32,9) = groebnerMatrix(12,52)/(groebnerMatrix(12,41));
  groebnerMatrix(32,10) = groebnerMatrix(12,53)/(groebnerMatrix(12,41));
  groebnerMatrix(32,12) = -groebnerMatrix(14,54)/(groebnerMatrix(14,43));
  groebnerMatrix(32,13) = -groebnerMatrix(14,55)/(groebnerMatrix(14,43));
  groebnerMatrix(32,15) = -groebnerMatrix(14,56)/(groebnerMatrix(14,43));
  groebnerMatrix(32,17) = groebnerMatrix(12,54)/(groebnerMatrix(12,41));
  groebnerMatrix(32,18) = (groebnerMatrix(12,55)/(groebnerMatrix(12,41))-groebnerMatrix(14,57)/(groebnerMatrix(14,43)));
  groebnerMatrix(32,19) = groebnerMatrix(12,56)/(groebnerMatrix(12,41));
  groebnerMatrix(32,20) = groebnerMatrix(12,57)/(groebnerMatrix(12,41));
  groebnerMatrix(32,22) = -groebnerMatrix(14,58)/(groebnerMatrix(14,43));
  groebnerMatrix(32,24) = groebnerMatrix(12,58)/(groebnerMatrix(12,41));
  groebnerMatrix(32,35) = -groebnerMatrix(14,65)/(groebnerMatrix(14,43));
  groebnerMatrix(32,36) = -groebnerMatrix(14,66)/(groebnerMatrix(14,43));
  groebnerMatrix(32,38) = -groebnerMatrix(14,67)/(groebnerMatrix(14,43));
  groebnerMatrix(32,40) = groebnerMatrix(12,65)/(groebnerMatrix(12,41));
  groebnerMatrix(32,41) = (groebnerMatrix(12,66)/(groebnerMatrix(12,41))-groebnerMatrix(14,68)/(groebnerMatrix(14,43)));
  groebnerMatrix(32,42) = groebnerMatrix(12,67)/(groebnerMatrix(12,41));
  groebnerMatrix(32,43) = groebnerMatrix(12,68)/(groebnerMatrix(12,41));
  groebnerMatrix(32,45) = -groebnerMatrix(14,69)/(groebnerMatrix(14,43));
  groebnerMatrix(32,46) = -groebnerMatrix(14,70)/(groebnerMatrix(14,43));
  groebnerMatrix(32,48) = -groebnerMatrix(14,71)/(groebnerMatrix(14,43));
  groebnerMatrix(32,50) = groebnerMatrix(12,69)/(groebnerMatrix(12,41));
  groebnerMatrix(32,51) = (groebnerMatrix(12,70)/(groebnerMatrix(12,41))-groebnerMatrix(14,72)/(groebnerMatrix(14,43)));
  groebnerMatrix(32,52) = groebnerMatrix(12,71)/(groebnerMatrix(12,41));
  groebnerMatrix(32,53) = groebnerMatrix(12,72)/(groebnerMatrix(12,41));
  groebnerMatrix(32,55) = -groebnerMatrix(14,73)/(groebnerMatrix(14,43));
  groebnerMatrix(32,57) = groebnerMatrix(12,73)/(groebnerMatrix(12,41));
  groebnerMatrix(32,60) = -groebnerMatrix(14,74)/(groebnerMatrix(14,43));
  groebnerMatrix(32,61) = -groebnerMatrix(14,75)/(groebnerMatrix(14,43));
  groebnerMatrix(32,63) = -groebnerMatrix(14,76)/(groebnerMatrix(14,43));
  groebnerMatrix(32,65) = groebnerMatrix(12,74)/(groebnerMatrix(12,41));
  groebnerMatrix(32,66) = (groebnerMatrix(12,75)/(groebnerMatrix(12,41))-groebnerMatrix(14,77)/(groebnerMatrix(14,43)));
  groebnerMatrix(32,67) = groebnerMatrix(12,76)/(groebnerMatrix(12,41));
  groebnerMatrix(32,68) = groebnerMatrix(12,77)/(groebnerMatrix(12,41));
  groebnerMatrix(32,70) = -groebnerMatrix(14,78)/(groebnerMatrix(14,43));
  groebnerMatrix(32,72) = groebnerMatrix(12,78)/(groebnerMatrix(12,41));
  groebnerMatrix(32,75) = -groebnerMatrix(14,79)/(groebnerMatrix(14,43));
  groebnerMatrix(32,77) = groebnerMatrix(12,79)/(groebnerMatrix(12,41));
}